

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
::Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
          (Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
           *this,ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s)

{
  ulong *puVar1;
  HashVerifier<AutoFile> *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(ulong **)this;
  this_00 = s->m_substream;
  AutoFile::read(this_00->m_source,(int)&local_24,(void *)0x4,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)&local_24,4);
  *puVar1 = (ulong)local_24;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }